

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeoutMonitor.cpp
# Opt level: O1

void __thiscall helics::TimeoutMonitor::pingSub(TimeoutMonitor *this,CoreBroker *brk)

{
  vector<helics::linkConnection,_std::allocator<helics::linkConnection>_> *this_00;
  pointer *pplVar1;
  pointer pBVar2;
  linkConnection *plVar3;
  iterator __position;
  bool bVar4;
  rep rVar5;
  long lVar6;
  pointer plVar7;
  GlobalFederateId *pGVar8;
  BasicBrokerInfo *brkr;
  pointer pBVar9;
  long lVar10;
  long lVar11;
  ActionMessage png;
  ActionMessage local_e8;
  
  rVar5 = std::chrono::_V2::steady_clock::now();
  pBVar9 = (brk->mBrokers).dataStorage.
           super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pBVar2 = (brk->mBrokers).dataStorage.
           super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pBVar9 != pBVar2) {
    this_00 = &this->connections;
    bVar4 = false;
    do {
      plVar3 = (this->connections).
               super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>.
               _M_impl.super__Vector_impl_data._M_start;
      __position._M_current =
           (this->connections).
           super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      lVar6 = (long)__position._M_current - (long)plVar3 >> 4;
      lVar11 = lVar6;
      if (__position._M_current != plVar3) {
        pGVar8 = &plVar3->connection;
        lVar10 = 0;
        do {
          lVar11 = lVar10;
          if (pGVar8->gid == (pBVar9->global_id).gid) break;
          lVar10 = lVar10 + 1;
          pGVar8 = pGVar8 + 4;
          lVar11 = lVar6;
        } while (lVar6 + (ulong)(lVar6 == 0) != lVar10);
      }
      if (lVar11 == lVar6) {
        if (__position._M_current ==
            (this->connections).
            super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>::
          _M_realloc_insert<>(this_00,__position);
        }
        else {
          (__position._M_current)->waitingForPingReply = false;
          (__position._M_current)->activeConnection = false;
          (__position._M_current)->disablePing = false;
          (__position._M_current)->field_0x3 = 0;
          (__position._M_current)->connection = 0;
          ((__position._M_current)->lastPing).__d.__r = 0;
          pplVar1 = &(this->connections).
                     super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pplVar1 = *pplVar1 + 1;
        }
        plVar7 = (this_00->
                 super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        plVar7[lVar11].connection.gid = (pBVar9->global_id).gid;
        plVar7[lVar11].disablePing = pBVar9->_disable_ping;
      }
      plVar7 = (this_00->
               super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if (pBVar9->state < ERROR_STATE) {
        if (plVar7[lVar11].disablePing == false) {
          plVar7 = plVar7 + lVar11;
          plVar7->waitingForPingReply = true;
          plVar7->activeConnection = true;
          (plVar7->lastPing).__d.__r = rVar5;
          ActionMessage::ActionMessage(&local_e8,(uint)pBVar9->_core + cmd_broker_setup | cmd_ping);
          local_e8.source_id.gid = (brk->super_BrokerBase).global_broker_id_local.gid;
          local_e8.dest_id.gid = (pBVar9->global_id).gid;
          (*(brk->super_Broker)._vptr_Broker[0x22])(brk,(ulong)(uint)(pBVar9->route).rid,&local_e8);
          ActionMessage::~ActionMessage(&local_e8);
          bVar4 = true;
        }
      }
      else {
        plVar7[lVar11].activeConnection = false;
      }
      pBVar9 = pBVar9 + 1;
    } while (pBVar9 != pBVar2);
    if (bVar4) {
      ActionMessage::ActionMessage(&local_e8,cmd_broker_configure);
      local_e8.dest_id.gid = (brk->super_BrokerBase).global_id._M_i.gid;
      local_e8.source_id.gid = (brk->super_BrokerBase).global_id._M_i.gid;
      local_e8.messageID = 0x25f;
      local_e8.flags._0_1_ = (byte)local_e8.flags | 0x20;
      BrokerBase::addActionMessage(&brk->super_BrokerBase,&local_e8);
      ActionMessage::~ActionMessage(&local_e8);
    }
  }
  return;
}

Assistant:

void TimeoutMonitor::pingSub(CoreBroker* brk)
{
    auto now = std::chrono::steady_clock::now();
    bool activePing = false;
    for (const auto& brkr : brk->mBrokers) {
        size_t cindex = connections.size();
        for (size_t ii = 0; ii < cindex; ++ii) {
            if (connections[ii].connection == brkr.global_id) {
                cindex = ii;
                break;
            }
        }
        if (cindex == connections.size()) {
            connections.emplace_back();
            connections[cindex].connection = brkr.global_id;
            connections[cindex].disablePing = brkr._disable_ping;
        }

        if (brkr.state < ConnectionState::ERROR_STATE) {
            if (connections[cindex].disablePing) {
                continue;
            }
            connections[cindex].activeConnection = true;
            connections[cindex].waitingForPingReply = true;
            connections[cindex].lastPing = now;
            // send the ping
            ActionMessage png(brkr._core ? CMD_PING : CMD_BROKER_PING);
            png.source_id = brk->global_broker_id_local;
            png.dest_id = brkr.global_id;
            brk->transmit(brkr.route, png);
            activePing = true;
        } else {
            connections[cindex].activeConnection = false;
        }
    }
    if (activePing) {
        ActionMessage tickf(CMD_BROKER_CONFIGURE);
        tickf.dest_id = GlobalFederateId(brk->global_id);
        tickf.source_id = GlobalFederateId(brk->global_id);
        tickf.messageID = REQUEST_TICK_FORWARDING;
        setActionFlag(tickf, indicator_flag);
        brk->addActionMessage(tickf);
    }
}